

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  int iVar1;
  Expr *p;
  Expr *pEVar2;
  Expr *pNew;
  Expr *pDup;
  Expr *pE;
  ExprList_item *pEStack_50;
  int iCol;
  ExprList_item *pItem;
  sqlite3 *psStack_40;
  int moreToDo;
  sqlite3 *db;
  ExprList *pEList;
  ExprList *pOrderBy;
  Select *pSStack_20;
  int i;
  Select *pSelect_local;
  Parse *pParse_local;
  
  pItem._4_4_ = 1;
  pEList = pSelect->pOrderBy;
  if (pEList == (ExprList *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else {
    psStack_40 = pParse->db;
    pSStack_20 = pSelect;
    pSelect_local = (Select *)pParse;
    if (psStack_40->aLimit[2] < pEList->nExpr) {
      sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
      pParse_local._4_4_ = 1;
    }
    else {
      for (pOrderBy._4_4_ = 0; pOrderBy._4_4_ < pEList->nExpr; pOrderBy._4_4_ = pOrderBy._4_4_ + 1)
      {
        pEList->a[pOrderBy._4_4_].field_0x19 = pEList->a[pOrderBy._4_4_].field_0x19 & 0xfe;
      }
      pSelect->pNext = (Select *)0x0;
      for (; pSStack_20->pPrior != (Select *)0x0; pSStack_20 = pSStack_20->pPrior) {
        pSStack_20->pPrior->pNext = pSStack_20;
      }
      for (; pSStack_20 != (Select *)0x0 && pItem._4_4_ != 0; pSStack_20 = pSStack_20->pNext) {
        pItem._4_4_ = 0;
        db = (sqlite3 *)pSStack_20->pEList;
        pOrderBy._4_4_ = 0;
        pEStack_50 = pEList->a;
        for (; pOrderBy._4_4_ < pEList->nExpr; pOrderBy._4_4_ = pOrderBy._4_4_ + 1) {
          pE._4_4_ = -1;
          if ((pEStack_50->field_0x19 & 1) == 0) {
            p = sqlite3ExprSkipCollate(pEStack_50->pExpr);
            iVar1 = sqlite3ExprIsInteger(p,(int *)((long)&pE + 4));
            if (iVar1 == 0) {
              pE._4_4_ = resolveAsName((Parse *)pSelect_local,(ExprList *)db,p);
              if (pE._4_4_ == 0) {
                pEVar2 = sqlite3ExprDup(psStack_40,p,0);
                if (psStack_40->mallocFailed == '\0') {
                  pE._4_4_ = resolveOrderByTermToExprList((Parse *)pSelect_local,pSStack_20,pEVar2);
                }
                sqlite3ExprDelete(psStack_40,pEVar2);
              }
            }
            else if ((pE._4_4_ < 1) || (*(int *)&db->pVfs < pE._4_4_)) {
              resolveOutOfRangeError
                        ((Parse *)pSelect_local,"ORDER",pOrderBy._4_4_ + 1,*(int *)&db->pVfs);
              return 1;
            }
            if (pE._4_4_ < 1) {
              pItem._4_4_ = 1;
            }
            else {
              pEVar2 = sqlite3Expr(psStack_40,0x81,(char *)0x0);
              if (pEVar2 == (Expr *)0x0) {
                return 1;
              }
              pEVar2->flags = pEVar2->flags | 0x400;
              (pEVar2->u).iValue = pE._4_4_;
              if (pEStack_50->pExpr == p) {
                pEStack_50->pExpr = pEVar2;
              }
              else {
                pEStack_50->pExpr->pLeft = pEVar2;
              }
              sqlite3ExprDelete(psStack_40,p);
              pEStack_50->iOrderByCol = (u16)pE._4_4_;
              pEStack_50->field_0x19 = pEStack_50->field_0x19 & 0xfe | 1;
            }
          }
          pEStack_50 = pEStack_50 + 1;
        }
      }
      for (pOrderBy._4_4_ = 0; pOrderBy._4_4_ < pEList->nExpr; pOrderBy._4_4_ = pOrderBy._4_4_ + 1)
      {
        if ((pEList->a[pOrderBy._4_4_].field_0x19 & 1) == 0) {
          sqlite3ErrorMsg((Parse *)pSelect_local,
                          "%r ORDER BY term does not match any column in the result set",
                          (ulong)(pOrderBy._4_4_ + 1));
          return 1;
        }
      }
      pParse_local._4_4_ = 0;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
#if SQLITE_MAX_COLUMN
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
#endif
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          assert( pItem->pExpr->op==TK_COLLATE );
          assert( pItem->pExpr->pLeft==pE );
          pItem->pExpr->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}